

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall zstr::istreambuf::~istreambuf(istreambuf *this)

{
  istreambuf *in_RDI;
  
  ~istreambuf(in_RDI);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }